

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage9.cpp
# Opt level: O3

void test(bool verbose)

{
  atomic_llong aVar1;
  atomic_llong aVar2;
  atomic_llong aVar3;
  memory_resource *pmVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  __atomic_base<int> _Var7;
  Framer framer;
  pstring mstring;
  pstring astring;
  test_resource tr;
  test_resource dr;
  Framer local_250;
  __atomic_base<long_long> local_248;
  test_resource *local_240;
  undefined8 local_238;
  undefined8 *local_230;
  test_resource *local_228;
  undefined8 local_220;
  undefined8 *local_218;
  test_resource local_210;
  test_resource local_120;
  
  Framer::Framer(&local_250,"Monitoring",verbose);
  std::pmr::test_resource::test_resource(&local_120,"default");
  aVar3.super___atomic_base<long_long>._M_i =
       local_120.m_blocks_in_use_.super___atomic_base<long_long>._M_i;
  local_248 = local_120.m_total_blocks_.super___atomic_base<long_long>._M_i;
  pmVar4 = (memory_resource *)std::pmr::set_default_resource(&local_120.super_memory_resource);
  _Var7._M_i._1_3_ = 0;
  _Var7._M_i._0_1_ = verbose;
  local_120.m_verbose_flag_.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)_Var7._M_i;
  std::pmr::test_resource::test_resource(&local_210,"object");
  aVar2.super___atomic_base<long_long>._M_i =
       local_210.m_total_blocks_.super___atomic_base<long_long>._M_i;
  aVar1.super___atomic_base<long_long>._M_i =
       local_210.m_blocks_in_use_.super___atomic_base<long_long>._M_i;
  local_220 = 7;
  local_228 = &local_210;
  local_210.m_verbose_flag_.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)_Var7._M_i;
  puVar5 = (undefined8 *)(**(code **)(local_210._0_8_ + 0x10))(&local_210,8,1);
  *puVar5 = 0x6c6f6f66726162;
  local_218 = puVar5;
  if (local_210.m_total_blocks_.super___atomic_base<long_long>._M_i ==
      aVar2.super___atomic_base<long_long>._M_i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"trm.is_total_up()",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != true\n",9);
  }
  if ((long)local_210.m_blocks_in_use_.super___atomic_base<long_long>._M_i -
      (long)aVar1.super___atomic_base<long_long>._M_i != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"trm.delta_blocks_in_use()",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1",1);
    local_240._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_240,1);
    poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," != ",4);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    local_240 = (test_resource *)CONCAT71(local_240._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_240,1);
  }
  local_238 = 7;
  local_220 = 0xffffffffffffffff;
  local_218 = (undefined8 *)0x0;
  local_240 = &local_210;
  local_230 = puVar5;
  if (local_120.m_blocks_in_use_.super___atomic_base<long_long>._M_i !=
      aVar3.super___atomic_base<long_long>._M_i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"drm.is_in_use_same()",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != true\n",9);
  }
  if (local_120.m_total_blocks_.super___atomic_base<long_long>._M_i !=
      (__atomic_base<long_long>)local_248._M_i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"drm.is_total_same()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != true\n",9);
  }
  (**(code **)(local_210._0_8_ + 0x18))(&local_210,puVar5,8,1);
  (**(code **)(local_210._0_8_ + 0x18))(&local_210,0,0,1);
  std::pmr::test_resource::~test_resource(&local_210);
  std::pmr::set_default_resource(pmVar4);
  std::pmr::test_resource::~test_resource(&local_120);
  Framer::~Framer(&local_250);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Monitoring", verbose };

    std::pmr::test_resource           dr{ "default" };
    std::pmr::test_resource_monitor  drm{ dr };
    std::pmr::default_resource_guard drg{ &dr };
    dr.set_verbose(verbose);

    std::pmr::test_resource          tr{ "object" };
    std::pmr::test_resource_monitor trm{ tr };
    tr.set_verbose(verbose);

    pstring astring{ "barfool", &tr };
    ASSERT(trm.is_total_up());
    ASSERT_EQ(trm.delta_blocks_in_use(), 1);
    trm.reset();

    pstring mstring{ std::move(astring) };

    ASSERT(drm.is_in_use_same()); // Did not allocate`bstring` with this
    ASSERT(drm.is_total_same());  // Did not allocate /anything/ with this
}